

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMdi::Rearranger_*>::relocate
          (QArrayDataPointer<QMdi::Rearranger_*> *this,qsizetype offset,Rearranger ***data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QMdi::Rearranger_*> *in_RDI;
  Rearranger ***unaff_retaddr;
  Rearranger **res;
  Rearranger **first;
  QArrayDataPointer<QMdi::Rearranger_*> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QMdi::Rearranger*,long_long>
            (first,(longlong)in_RDI,(Rearranger **)0x626407);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QMdi::Rearranger*>,QMdi::Rearranger*const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }